

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checks.h
# Opt level: O1

string * rtc::MakeCheckOpString<int,short>(int *v1,short *v2,char *names)

{
  size_t sVar1;
  ostream *poVar2;
  string *psVar3;
  ostringstream ss;
  undefined1 auStack_198 [8];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (names == (char *)0x0) {
    std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
  }
  else {
    sVar1 = strlen(names);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,names,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," (",2);
  poVar2 = (ostream *)std::ostream::operator<<(local_190,*v1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," vs. ",5);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*v2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  psVar3 = (string *)operator_new(0x20);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return psVar3;
}

Assistant:

std::string* MakeCheckOpString(const t1& v1, const t2& v2, const char* names) {
  std::ostringstream ss;
  ss << names << " (" << v1 << " vs. " << v2 << ")";
  std::string* msg = new std::string(ss.str());
  return msg;
}